

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O0

cram_index * cram_index_query(cram_fd *fd,int refid,int pos,cram_index *from)

{
  bool bVar1;
  cram_index *e;
  int local_30;
  int k;
  int j;
  int i;
  cram_index *from_local;
  int pos_local;
  int refid_local;
  cram_fd *fd_local;
  
  if ((refid + 1 < 0) || (fd->index_sz <= refid + 1)) {
    fd_local = (cram_fd *)0x0;
  }
  else {
    k = 0;
    local_30 = fd->index[refid + 1].nslice + -1;
    _j = from;
    if (from == (cram_index *)0x0) {
      _j = fd->index + (refid + 1);
    }
    e._4_4_ = local_30 / 2;
    while (e._4_4_ != k) {
      if (refid < _j->e[e._4_4_].refid) {
        local_30 = e._4_4_;
      }
      else if (_j->e[e._4_4_].refid < refid) {
        k = e._4_4_;
      }
      else if (_j->e[e._4_4_].start < pos) {
        if (_j->e[e._4_4_].start < pos) {
          k = e._4_4_;
        }
      }
      else {
        local_30 = e._4_4_;
      }
      e._4_4_ = (local_30 - k) / 2 + k;
    }
    if ((_j->e[local_30].start < pos) && (_j->e[local_30].refid == refid)) {
      k = local_30;
    }
    while( true ) {
      bVar1 = false;
      if (0 < k) {
        bVar1 = pos <= _j->e[k + -1].end;
      }
      if (!bVar1) break;
      k = k + -1;
    }
    if (((k + 1 < _j->nslice) && (_j->e[k + 1].start == pos)) && (_j->e[k + 1].refid == refid)) {
      k = k + 1;
    }
    fd_local = (cram_fd *)(_j->e + k);
  }
  return (cram_index *)fd_local;
}

Assistant:

cram_index *cram_index_query(cram_fd *fd, int refid, int pos, 
			     cram_index *from) {
    int i, j, k;
    cram_index *e;

    if (refid+1 < 0 || refid+1 >= fd->index_sz)
	return NULL;

    i = 0, j = fd->index[refid+1].nslice-1;

    if (!from)
	from = &fd->index[refid+1];

    for (k = j/2; k != i; k = (j-i)/2 + i) {
	if (from->e[k].refid > refid) {
	    j = k;
	    continue;
	}

	if (from->e[k].refid < refid) {
	    i = k;
	    continue;
	}

	if (from->e[k].start >= pos) {
	    j = k;
	    continue;
	}

	if (from->e[k].start < pos) {
	    i = k;
	    continue;
	}
    }
    // i==j or i==j-1. Check if j is better.
    if (from->e[j].start < pos && from->e[j].refid == refid)
	i = j;

    /* The above found *a* bin overlapping, but not necessarily the first */
    while (i > 0 && from->e[i-1].end >= pos)
	i--;

    /* Special case for matching a start pos */
    if (i+1 < from->nslice &&
	from->e[i+1].start == pos &&
	from->e[i+1].refid == refid)
	i++;

    e = &from->e[i];

    return e;
}